

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

bool __thiscall
duckdb_snappy::SnappyIOVecWriter::Append(SnappyIOVecWriter *this,char *ip,size_t len,char **param_3)

{
  iovec *piVar1;
  size_t sVar2;
  bool bVar3;
  char *__dest;
  ulong __n;
  
  if (this->output_limit_ < this->total_written_ + len) {
LAB_002e3cbe:
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (len != 0) {
      sVar2 = this->curr_iov_remaining_;
      do {
        if (sVar2 == 0) {
          piVar1 = this->curr_iov_;
          if (this->output_iov_end_ <= piVar1 + 1) goto LAB_002e3cbe;
          this->curr_iov_ = piVar1 + 1;
          __dest = (char *)piVar1[1].iov_base;
          this->curr_iov_output_ = __dest;
          sVar2 = piVar1[1].iov_len;
          this->curr_iov_remaining_ = sVar2;
        }
        else {
          __dest = this->curr_iov_output_;
        }
        __n = sVar2;
        if (len <= sVar2) {
          __n = len;
        }
        switchD_0033274c::default(__dest,ip,__n);
        this->curr_iov_output_ = this->curr_iov_output_ + __n;
        sVar2 = this->curr_iov_remaining_ - __n;
        this->curr_iov_remaining_ = sVar2;
        this->total_written_ = this->total_written_ + __n;
        ip = ip + __n;
        len = len - __n;
      } while (len != 0);
    }
  }
  return bVar3;
}

Assistant:

inline bool Append(const char* ip, size_t len, char**) {
    if (total_written_ + len > output_limit_) {
      return false;
    }

    return AppendNoCheck(ip, len);
  }